

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O2

void apply_sharpen(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,float sharpness_val)

{
  pointer pMVar1;
  MatCommaInitializer_<double> *pMVar2;
  MatCommaInitializer_ *pMVar3;
  ostream *poVar4;
  Mat *img;
  pointer pMVar5;
  undefined8 local_180;
  MatCommaInitializer_<double> local_178;
  undefined1 local_150 [16];
  undefined8 local_140;
  undefined1 local_f0 [16];
  undefined8 local_e0;
  Mat sharpeningKernel;
  
  cv::Mat_<double>::Mat_((Mat_<double> *)local_f0,3,3);
  cv::operator<<(&local_178,(Mat_<double> *)local_f0,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(&local_178,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,sharpness_val);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  pMVar3 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar2,0);
  cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)local_150,pMVar3);
  cv::Mat::Mat(&sharpeningKernel,(Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_f0);
  if ((sharpness_val != 1.0) || (NAN(sharpness_val))) {
    cv::Mat_<double>::Mat_((Mat_<double> *)local_f0,3,3);
    cv::operator<<(&local_178,(Mat_<double> *)local_f0,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(&local_178,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,sharpness_val);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar2 = cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    pMVar3 = (MatCommaInitializer_ *)cv::MatCommaInitializer_<double>::operator_(pMVar2,-1);
    cv::MatCommaInitializer_::operator_cast_to_Mat_((Mat_<double> *)local_150,pMVar3);
    cv::Mat::operator=(&sharpeningKernel,(Mat *)local_150);
    cv::Mat::~Mat((Mat *)local_150);
    cv::Mat::~Mat((Mat *)local_f0);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)color::blue_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"Changing Sharpness : ");
  std::operator<<(poVar4,(string *)color::reset_abi_cxx11_);
  pMVar1 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar5 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start; pMVar5 != pMVar1; pMVar5 = pMVar5 + 0x60) {
    local_140 = 0;
    local_e0 = 0;
    local_150._0_4_ = 0x1010000;
    local_f0._0_4_ = 0x2010000;
    local_178.it.super_MatConstIterator_<double>.super_MatConstIterator.ptr = (uchar *)0x0;
    local_178.it.super_MatConstIterator_<double>.super_MatConstIterator.m._0_4_ = 0x1010000;
    local_178.it.super_MatConstIterator_<double>.super_MatConstIterator.elemSize =
         (size_t)&sharpeningKernel;
    local_180 = 0xffffffffffffffff;
    local_150._8_8_ = pMVar5;
    local_f0._8_8_ = pMVar5;
    cv::filter2D(0,local_150,local_f0,0xffffffffffffffff,&local_178,&local_180,4);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)color::green_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"Done");
  poVar4 = std::operator<<(poVar4,(string *)color::reset_abi_cxx11_);
  std::endl<char,std::char_traits<char>>(poVar4);
  cv::Mat::~Mat(&sharpeningKernel);
  return;
}

Assistant:

void apply_sharpen(std::vector<cv::Mat> &image_list, float sharpness_val) {
   Mat sharpeningKernel = (Mat_<double>(3,3) << 0, 0, 0, 0, sharpness_val, 0, 0, 0, 0);
   if(sharpness_val != 1)
   {
      sharpeningKernel = (Mat_<double>(3,3) << -1, -1, -1, -1, sharpness_val, -1, -1, -1, -1);
   }
   std::cout << color::blue << "Changing Sharpness : " << color::reset;
   for(auto &img: image_list) {
      filter2D(img, img, -1, sharpeningKernel);
   }
   std::cout << color::green << "Done" <<color::reset<<std::endl;
}